

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qgraphicsscenebsptreeindex.cpp
# Opt level: O3

void QGraphicsSceneBspTreeIndexPrivate::climbTree(QGraphicsItem *item,int *stackingOrder)

{
  qreal *pqVar1;
  long lVar2;
  double dVar3;
  QGraphicsItemPrivate *pQVar4;
  QGraphicsItem *pQVar5;
  GraphicsItemFlags GVar6;
  iterator __first;
  iterator __last;
  ulong uVar7;
  QGraphicsItem **ppQVar8;
  iterator iVar9;
  QGraphicsItem *pQVar10;
  value_type __val_1;
  iterator iVar11;
  QGraphicsItem **ppQVar12;
  value_type __val;
  size_t __n;
  uint uVar13;
  int iVar14;
  long lVar15;
  QGraphicsItemPrivate *pQVar16;
  long lVar17;
  iterator __i;
  QGraphicsItem **ppQVar18;
  long in_FS_OFFSET;
  bool bVar19;
  bool bVar20;
  QList<QGraphicsItem_*> local_50;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar4 = (item->d_ptr).d;
  uVar7 = (pQVar4->children).d.size;
  if (uVar7 == 0) {
    iVar14 = *stackingOrder;
    *stackingOrder = iVar14 + 1;
    pQVar4->globalStackingOrder = iVar14;
  }
  else {
    local_50.d.d = (pQVar4->children).d.d;
    local_50.d.ptr = (pQVar4->children).d.ptr;
    if (&(local_50.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      (((QArrayData *)&((local_50.d.d)->super_QArrayData).ref_)->ref_)._q_value.
      super___atomic_base<int>._M_i =
           (((QArrayData *)&((local_50.d.d)->super_QArrayData).ref_)->ref_)._q_value.
           super___atomic_base<int>._M_i + 1;
      UNLOCK();
    }
    local_50.d.size = uVar7;
    __first = QList<QGraphicsItem_*>::begin(&local_50);
    __last = QList<QGraphicsItem_*>::end(&local_50);
    if (__first.i != __last.i) {
      uVar7 = (long)__last.i - (long)__first.i >> 3;
      lVar15 = 0x3f;
      if (uVar7 != 0) {
        for (; uVar7 >> lVar15 == 0; lVar15 = lVar15 + -1) {
        }
      }
      std::
      __introsort_loop<QList<QGraphicsItem*>::iterator,long_long,__gnu_cxx::__ops::_Iter_comp_iter<bool(*)(QGraphicsItem_const*,QGraphicsItem_const*)>>
                (__first,__last,(ulong)(((uint)lVar15 ^ 0x3f) * 2) ^ 0x7e,
                 (_Iter_comp_iter<bool_(*)(const_QGraphicsItem_*,_const_QGraphicsItem_*)>)0x62558a);
      ppQVar18 = __first.i + 1;
      iVar9 = __first;
      if ((long)__last.i - (long)__first.i < 0x81) {
        for (; ppQVar18 != __last.i; ppQVar18 = ppQVar18 + 1) {
          pQVar5 = *ppQVar18;
          pQVar4 = (pQVar5->d_ptr).d;
          pQVar16 = ((*__first.i)->d_ptr).d;
          uVar7 = *(ulong *)&pQVar16->field_0x160 & 0x10000000000;
          uVar13 = (uint)((ulong)*(undefined8 *)&pQVar4->field_0x160 >> 0x28) & 1;
          if (uVar13 == (uint)(uVar7 >> 0x28)) {
            dVar3 = pQVar4->z;
            pqVar1 = &pQVar16->z;
            if ((dVar3 == *pqVar1) && (!NAN(dVar3) && !NAN(*pqVar1))) {
              if (pQVar4->siblingIndex <= pQVar16->siblingIndex) goto LAB_00623188;
              goto LAB_006231c3;
            }
            if (*pqVar1 <= dVar3 && dVar3 != *pqVar1) goto LAB_006231c3;
LAB_00623188:
            pQVar10 = *iVar9.i;
            pQVar16 = (pQVar10->d_ptr).d;
            uVar7 = *(ulong *)&pQVar16->field_0x160 & 0x10000000000;
            ppQVar12 = iVar9.i;
            ppQVar8 = ppQVar18;
            if (uVar13 != (uint)(uVar7 >> 0x28)) goto joined_r0x00623205;
            dVar3 = pQVar4->z;
            pqVar1 = &pQVar16->z;
            iVar11.i = ppQVar18;
            ppQVar8 = iVar9.i;
            if ((dVar3 != *pqVar1) || (NAN(dVar3) || NAN(*pqVar1))) {
              if (*pqVar1 <= dVar3 && dVar3 != *pqVar1) goto LAB_00623238;
            }
            else if (pQVar16->siblingIndex < pQVar4->siblingIndex) {
LAB_00623238:
              do {
                while( true ) {
                  ppQVar8[1] = pQVar10;
                  ppQVar12 = ppQVar8 + -1;
                  pQVar10 = ppQVar8[-1];
                  pQVar4 = (pQVar5->d_ptr).d;
                  pQVar16 = (pQVar10->d_ptr).d;
                  uVar7 = *(ulong *)&pQVar16->field_0x160 & 0x10000000000;
                  if (((uint)((ulong)*(undefined8 *)&pQVar4->field_0x160 >> 0x28) & 1) !=
                      (uint)(uVar7 >> 0x28)) break;
                  dVar3 = pQVar4->z;
                  pqVar1 = &pQVar16->z;
                  iVar11.i = ppQVar8;
                  ppQVar8 = ppQVar12;
                  if ((dVar3 != *pqVar1) || (NAN(dVar3) || NAN(*pqVar1))) {
                    if (dVar3 < *pqVar1 || dVar3 == *pqVar1) goto LAB_0062329e;
                  }
                  else if (pQVar4->siblingIndex <= pQVar16->siblingIndex) goto LAB_0062329e;
                }
joined_r0x00623205:
                iVar11.i = ppQVar8;
                ppQVar8 = ppQVar12;
              } while (uVar7 != 0);
            }
          }
          else {
            if (uVar7 == 0) goto LAB_00623188;
LAB_006231c3:
            lVar15 = (long)ppQVar18 - (long)__first.i >> 3;
            iVar11 = __first;
            if (0 < lVar15) {
              lVar17 = 1;
              do {
                iVar9.i[lVar17] = iVar9.i[lVar17 + -1];
                lVar2 = lVar15 + lVar17;
                lVar17 = lVar17 + -1;
              } while (1 < lVar2 - 1U);
            }
          }
LAB_0062329e:
          *iVar11.i = pQVar5;
          iVar9.i = iVar9.i + 1;
        }
      }
      else {
        __n = 8;
        do {
          ppQVar12 = __first.i + __n;
          pQVar5 = *(QGraphicsItem **)((long)__first.i + __n);
          pQVar4 = (pQVar5->d_ptr).d;
          pQVar16 = ((*__first.i)->d_ptr).d;
          uVar7 = *(ulong *)&pQVar16->field_0x160 & 0x10000000000;
          uVar13 = (uint)((ulong)*(undefined8 *)&pQVar4->field_0x160 >> 0x28) & 1;
          if (uVar13 == (uint)(uVar7 >> 0x28)) {
            dVar3 = pQVar4->z;
            pqVar1 = &pQVar16->z;
            if ((dVar3 == *pqVar1) && (!NAN(dVar3) && !NAN(*pqVar1))) {
              if (pQVar4->siblingIndex <= pQVar16->siblingIndex) goto LAB_0062302f;
              goto LAB_00623064;
            }
            if (*pqVar1 <= dVar3 && dVar3 != *pqVar1) goto LAB_00623064;
LAB_0062302f:
            pQVar10 = *iVar9.i;
            pQVar16 = (pQVar10->d_ptr).d;
            uVar7 = *(ulong *)&pQVar16->field_0x160 & 0x10000000000;
            iVar11.i = ppQVar12;
            if (uVar13 != (uint)(uVar7 >> 0x28)) goto LAB_0062310f;
            dVar3 = pQVar4->z;
            pqVar1 = &pQVar16->z;
            bVar20 = dVar3 == *pqVar1;
            bVar19 = dVar3 < *pqVar1;
            if ((bVar20) && (!NAN(dVar3) && !NAN(*pqVar1))) {
              iVar14 = pQVar4->siblingIndex;
              goto LAB_00623105;
            }
            while (ppQVar8 = iVar9.i, !bVar19 && !bVar20) {
              while( true ) {
                while( true ) {
                  ppQVar8[1] = pQVar10;
                  iVar9.i = ppQVar8 + -1;
                  pQVar10 = ppQVar8[-1];
                  pQVar4 = (pQVar5->d_ptr).d;
                  pQVar16 = (pQVar10->d_ptr).d;
                  uVar7 = *(ulong *)&pQVar16->field_0x160 & 0x10000000000;
                  iVar11.i = ppQVar8;
                  if (((uint)((ulong)*(undefined8 *)&pQVar4->field_0x160 >> 0x28) & 1) ==
                      (uint)(uVar7 >> 0x28)) break;
LAB_0062310f:
                  ppQVar8 = iVar9.i;
                  if (uVar7 == 0) goto LAB_0062309c;
                }
                dVar3 = pQVar4->z;
                pqVar1 = &pQVar16->z;
                bVar20 = dVar3 == *pqVar1;
                bVar19 = dVar3 < *pqVar1;
                if ((!bVar20) || (NAN(dVar3) || NAN(*pqVar1))) break;
                iVar14 = pQVar4->siblingIndex;
LAB_00623105:
                ppQVar8 = iVar9.i;
                if (iVar14 <= pQVar16->siblingIndex) goto LAB_0062309c;
              }
            }
          }
          else {
            if (uVar7 == 0) goto LAB_0062302f;
LAB_00623064:
            memmove(ppQVar18,__first.i,__n);
            iVar11 = __first;
          }
LAB_0062309c:
          *iVar11.i = pQVar5;
          __n = __n + 8;
          iVar9.i = ppQVar12;
        } while (__n != 0x80);
        ppQVar18 = __first.i + 0x10;
        if (ppQVar18 != __last.i) {
LAB_006232ce:
          pQVar10 = ppQVar18[-1];
          pQVar5 = *ppQVar18;
          pQVar4 = (pQVar5->d_ptr).d;
          pQVar16 = (pQVar10->d_ptr).d;
          uVar7 = *(ulong *)&pQVar16->field_0x160 & 0x10000000000;
          ppQVar12 = ppQVar18;
          if (((uint)((ulong)*(undefined8 *)&pQVar4->field_0x160 >> 0x28) & 1) ==
              (uint)(uVar7 >> 0x28)) {
            dVar3 = pQVar4->z;
            pqVar1 = &pQVar16->z;
            if ((dVar3 != *pqVar1) || (NAN(dVar3) || NAN(*pqVar1))) {
              if (*pqVar1 <= dVar3 && dVar3 != *pqVar1) goto LAB_00623338;
            }
            else if (pQVar16->siblingIndex < pQVar4->siblingIndex) {
LAB_00623338:
              do {
                *ppQVar12 = pQVar10;
                pQVar10 = ppQVar12[-2];
                pQVar4 = (pQVar5->d_ptr).d;
                pQVar16 = (pQVar10->d_ptr).d;
                uVar7 = *(ulong *)&pQVar16->field_0x160 & 0x10000000000;
                if (((uint)((ulong)*(undefined8 *)&pQVar4->field_0x160 >> 0x28) & 1) ==
                    (uint)(uVar7 >> 0x28)) {
                  dVar3 = pQVar4->z;
                  pqVar1 = &pQVar16->z;
                  if ((dVar3 != *pqVar1) || (NAN(dVar3) || NAN(*pqVar1))) {
                    if (dVar3 < *pqVar1 || dVar3 == *pqVar1) goto LAB_00623399;
                  }
                  else if (pQVar4->siblingIndex <= pQVar16->siblingIndex) goto LAB_00623399;
                }
                else if (uVar7 == 0) goto LAB_00623399;
                ppQVar12 = ppQVar12 + -1;
              } while( true );
            }
          }
          else if (uVar7 != 0) goto LAB_00623338;
          goto LAB_0062339d;
        }
      }
    }
LAB_006233ad:
    if (local_50.d.size == 0) {
      iVar14 = *stackingOrder;
      *stackingOrder = iVar14 + 1;
      ((item->d_ptr).d)->globalStackingOrder = iVar14;
    }
    else {
      uVar7 = 0;
      do {
        GVar6 = QGraphicsItem::flags(local_50.d.ptr[uVar7]);
        if (((uint)GVar6.super_QFlagsStorageHelper<QGraphicsItem::GraphicsItemFlag,_4>.
                   super_QFlagsStorage<QGraphicsItem::GraphicsItemFlag>.i >> 8 & 1) == 0) {
          climbTree(local_50.d.ptr[uVar7],stackingOrder);
        }
        uVar7 = uVar7 + 1;
      } while (uVar7 < (ulong)local_50.d.size);
      iVar14 = *stackingOrder;
      *stackingOrder = iVar14 + 1;
      ((item->d_ptr).d)->globalStackingOrder = iVar14;
      if (local_50.d.size != 0) {
        uVar7 = 0;
        do {
          GVar6 = QGraphicsItem::flags(local_50.d.ptr[uVar7]);
          if (((uint)GVar6.super_QFlagsStorageHelper<QGraphicsItem::GraphicsItemFlag,_4>.
                     super_QFlagsStorage<QGraphicsItem::GraphicsItemFlag>.i >> 8 & 1) != 0) {
            climbTree(local_50.d.ptr[uVar7],stackingOrder);
          }
          uVar7 = uVar7 + 1;
        } while (uVar7 < (ulong)local_50.d.size);
      }
    }
    if (&(local_50.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_50.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_50.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if (((local_50.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(&(local_50.d.d)->super_QArrayData,8,0x10);
      }
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return;
LAB_00623399:
  ppQVar12 = ppQVar12 + -1;
LAB_0062339d:
  *ppQVar12 = pQVar5;
  ppQVar18 = ppQVar18 + 1;
  if (ppQVar18 == __last.i) goto LAB_006233ad;
  goto LAB_006232ce;
}

Assistant:

void QGraphicsSceneBspTreeIndexPrivate::climbTree(QGraphicsItem *item, int *stackingOrder)
{
    if (!item->d_ptr->children.isEmpty()) {
        QList<QGraphicsItem *> childList = item->d_ptr->children;
        std::sort(childList.begin(), childList.end(), qt_closestLeaf);
        for (int i = 0; i < childList.size(); ++i) {
            QGraphicsItem *item = childList.at(i);
            if (!(item->flags() & QGraphicsItem::ItemStacksBehindParent))
                climbTree(childList.at(i), stackingOrder);
        }
        item->d_ptr->globalStackingOrder = (*stackingOrder)++;
        for (int i = 0; i < childList.size(); ++i) {
            QGraphicsItem *item = childList.at(i);
            if (item->flags() & QGraphicsItem::ItemStacksBehindParent)
                climbTree(childList.at(i), stackingOrder);
        }
    } else {
        item->d_ptr->globalStackingOrder = (*stackingOrder)++;
    }
}